

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::Write3dmSettings(ON_BinaryArchive *this,ON_3dmSettings *settings)

{
  bool bVar1;
  LengthUnitSystem LVar2;
  int iVar3;
  ON_PlugInRef *uuid;
  ON_3dmSettings *pOVar4;
  bool final_rc;
  ON_UUID *pid;
  int local_28;
  int count;
  int i;
  bool rc;
  ON_3dmSettings *settings_local;
  ON_BinaryArchive *this_local;
  
  bVar1 = Begin3dmTable(this,write3dm,settings_table);
  if (bVar1) {
    if (this->m_archive_3dm_settings != (ON_3dmSettings *)0x0) {
      pOVar4 = this->m_archive_3dm_settings;
      if (pOVar4 != (ON_3dmSettings *)0x0) {
        ON_3dmSettings::~ON_3dmSettings(pOVar4);
        operator_delete(pOVar4,0x618);
      }
      this->m_archive_3dm_settings = (ON_3dmSettings *)0x0;
    }
    count._3_1_ = BeginWrite3dmChunk(this,0x10000015,0);
    if (count._3_1_) {
      count._3_1_ = ON_3dmSettings::Write(settings,this);
      bVar1 = EndWrite3dmChunk(this);
      if (!bVar1) {
        count._3_1_ = false;
      }
    }
    if ((count._3_1_ != false) && (iVar3 = Archive3dmVersion(this), iVar3 == 3)) {
      iVar3 = ON_ClassArray<ON_PlugInRef>::Count(&settings->m_plugin_list);
      ON_SimpleArray<ON_UUID_struct>::SetCount(&this->m_V3_plugin_id_list,0);
      ON_SimpleArray<ON_UUID_struct>::SetCapacity(&this->m_V3_plugin_id_list,(long)(iVar3 + 5));
      for (local_28 = 0; local_28 < iVar3; local_28 = local_28 + 1) {
        uuid = ON_ClassArray<ON_PlugInRef>::operator[](&settings->m_plugin_list,local_28);
        bVar1 = ON_UuidIsNil(&uuid->m_plugin_id);
        if (!bVar1) {
          ON_SimpleArray<ON_UUID_struct>::Append(&this->m_V3_plugin_id_list,&uuid->m_plugin_id);
        }
      }
      ON_SimpleArray<ON_UUID_struct>::Append(&this->m_V3_plugin_id_list,&ON_v3_userdata_id);
      ON_SimpleArray<ON_UUID_struct>::Append(&this->m_V3_plugin_id_list,&ON_v4_userdata_id);
      ON_SimpleArray<ON_UUID_struct>::Append(&this->m_V3_plugin_id_list,&ON_opennurbs4_id);
      ON_SimpleArray<ON_UUID_struct>::Append(&this->m_V3_plugin_id_list,&ON_opennurbs5_id);
      ON_SimpleArray<ON_UUID_struct>::Append(&this->m_V3_plugin_id_list,&ON_opennurbs6_id);
      ON_SimpleArray<ON_UUID_struct>::Append(&this->m_V3_plugin_id_list,&ON_opennurbs7_id);
      ON_SimpleArray<ON_UUID_struct>::Append(&this->m_V3_plugin_id_list,&ON_rhino3_id);
      ON_SimpleArray<ON_UUID_struct>::Append(&this->m_V3_plugin_id_list,&ON_rhino4_id);
      ON_SimpleArray<ON_UUID_struct>::Append(&this->m_V3_plugin_id_list,&ON_rhino5_id);
      ON_SimpleArray<ON_UUID_struct>::Append(&this->m_V3_plugin_id_list,&ON_rhino6_id);
      ON_SimpleArray<ON_UUID_struct>::Append(&this->m_V3_plugin_id_list,&ON_rhino7_id);
      ON_SimpleArray<ON_UUID_struct>::QuickSort(&this->m_V3_plugin_id_list,ON_UuidCompare);
    }
    this_local._7_1_ = End3dmTable(this,settings_table,count._3_1_);
    if (this_local._7_1_) {
      pOVar4 = (ON_3dmSettings *)operator_new(0x618);
      ON_3dmSettings::ON_3dmSettings(pOVar4,settings);
      this->m_archive_3dm_settings = pOVar4;
      ON_3dmAnnotationContext::SetReferencedAnnotationSettings
                (&this->m_annotation_context,&this->m_archive_3dm_settings->m_AnnotationSettings);
      LVar2 = ON_UnitSystem::UnitSystem
                        (&(this->m_archive_3dm_settings->m_ModelUnitsAndTolerances).m_unit_system);
      ON_3dmAnnotationContext::SetModelLengthUnitSystem(&this->m_annotation_context,LVar2);
      LVar2 = ON_UnitSystem::UnitSystem
                        (&(this->m_archive_3dm_settings->m_PageUnitsAndTolerances).m_unit_system);
      ON_3dmAnnotationContext::SetPageLengthUnitSystem(&this->m_annotation_context,LVar2);
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_BinaryArchive::Write3dmSettings(
      const ON_3dmSettings& settings
      )
{
  if (!Begin3dmTable(ON::archive_mode::write3dm,ON_3dmArchiveTableType::settings_table))
    return false;

  if (nullptr != m_archive_3dm_settings)
  {
    delete m_archive_3dm_settings;
    m_archive_3dm_settings = nullptr;
  }

  // version 2+ file settings chunk
  bool rc = BeginWrite3dmChunk(TCODE_SETTINGS_TABLE,0);
  if ( rc ) {
    rc = settings.Write( *this );
    if ( !EndWrite3dmChunk() )
      rc = false;
  }

  if ( rc && 3 == Archive3dmVersion() )
  {
    // Build a list of ids of plug-ins that support saving
    // V3 user data.  If a plug-in id is not in this list,
    // the user data will not be saved in the V3 archive.
    int i, count = settings.m_plugin_list.Count();
    m_V3_plugin_id_list.SetCount(0);
    m_V3_plugin_id_list.SetCapacity( count+5 );
    for ( i = 0; i < count; i++ )
    {
      const ON_UUID& pid = settings.m_plugin_list[i].m_plugin_id;
      if ( !ON_UuidIsNil(pid) )
        m_V3_plugin_id_list.Append(pid);
    }

    // These ids insure V3, V4 and V5 core user data will round trip
    // through SaveAs V3 and SaveAs V4
    m_V3_plugin_id_list.Append( ON_v3_userdata_id );
    m_V3_plugin_id_list.Append( ON_v4_userdata_id );
    m_V3_plugin_id_list.Append( ON_opennurbs4_id );
    m_V3_plugin_id_list.Append( ON_opennurbs5_id );
    m_V3_plugin_id_list.Append( ON_opennurbs6_id );
    m_V3_plugin_id_list.Append( ON_opennurbs7_id );
    m_V3_plugin_id_list.Append( ON_rhino3_id );
    m_V3_plugin_id_list.Append( ON_rhino4_id );
    m_V3_plugin_id_list.Append( ON_rhino5_id );
    m_V3_plugin_id_list.Append( ON_rhino6_id );
    m_V3_plugin_id_list.Append( ON_rhino7_id );
    m_V3_plugin_id_list.QuickSort( ON_UuidCompare );
  }

  bool final_rc = End3dmTable(ON_3dmArchiveTableType::settings_table,rc);

  if (final_rc)
  {
    m_archive_3dm_settings = new ON_3dmSettings(settings);
    m_annotation_context.SetReferencedAnnotationSettings(&m_archive_3dm_settings->m_AnnotationSettings);
    m_annotation_context.SetModelLengthUnitSystem(m_archive_3dm_settings->m_ModelUnitsAndTolerances.m_unit_system.UnitSystem());
    m_annotation_context.SetPageLengthUnitSystem(m_archive_3dm_settings->m_PageUnitsAndTolerances.m_unit_system.UnitSystem());
  }

  return final_rc;
}